

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.hpp
# Opt level: O0

void __thiscall
helics::TimeData::TimeData(TimeData *this,Time start,TimeState startState,uint8_t resLevel)

{
  undefined1 in_CL;
  undefined1 in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_RSI;
  in_RDI[3] = in_RSI;
  in_RDI[4] = 0;
  memset((GlobalFederateId *)(in_RDI + 5),0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)(in_RDI + 5));
  memset((GlobalFederateId *)((long)in_RDI + 0x2c),0,4);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)((long)in_RDI + 0x2c));
  *(undefined1 *)(in_RDI + 6) = in_DL;
  *(undefined1 *)((long)in_RDI + 0x31) = 0;
  *(undefined1 *)((long)in_RDI + 0x32) = 0;
  *(undefined1 *)((long)in_RDI + 0x33) = 0;
  *(undefined1 *)((long)in_RDI + 0x34) = 0xfe;
  *(undefined1 *)((long)in_RDI + 0x35) = in_CL;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined4 *)((long)in_RDI + 0x44) = 0;
  return;
}

Assistant:

explicit TimeData(Time start,
                      TimeState startState = TimeState::initialized,
                      std::uint8_t resLevel = 0U):
        next{start}, Te{start}, minDe{start}, TeAlt{start}, mTimeState{startState},
        restrictionLevel{resLevel} {}